

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O0

void __thiscall
NaStateSpaceModel::SetMatrices(NaStateSpaceModel *this,NaMatrix *mA,NaMatrix *mB,NaMatrix *mC)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint nR;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  uint nFbDepth_;
  undefined4 in_stack_ffffffffffffffc8;
  
  iVar1 = (**(code **)(*in_RSI + 0x38))();
  if (iVar1 != 0) {
    iVar1 = (**(code **)(*in_RSI + 0x30))();
    if (iVar1 != 0) {
      iVar1 = (**(code **)(*in_RDX + 0x38))();
      if (iVar1 != 0) {
        iVar1 = (**(code **)(*in_RDX + 0x30))();
        if (iVar1 != 0) {
          iVar1 = (**(code **)(*in_RCX + 0x38))();
          if (iVar1 != 0) {
            iVar1 = (**(code **)(*in_RCX + 0x30))();
            if (iVar1 != 0) {
              iVar1 = (**(code **)(*in_RSI + 0x30))();
              iVar2 = (**(code **)(*in_RSI + 0x38))();
              if (iVar1 == iVar2) {
                iVar2 = (**(code **)(*in_RSI + 0x30))();
                iVar3 = (**(code **)(*in_RDX + 0x30))();
                if (iVar2 == iVar3) {
                  nR = (**(code **)(*in_RSI + 0x30))();
                  uVar4 = (**(code **)(*in_RCX + 0x38))();
                  if (nR == uVar4) {
                    NaMatrix::operator=((NaMatrix *)CONCAT44(iVar1,iVar2),
                                        (NaMatrix *)CONCAT44(nR,in_stack_ffffffffffffffc8));
                    NaMatrix::operator=((NaMatrix *)CONCAT44(iVar1,iVar2),
                                        (NaMatrix *)CONCAT44(nR,in_stack_ffffffffffffffc8));
                    NaMatrix::operator=((NaMatrix *)CONCAT44(iVar1,iVar2),
                                        (NaMatrix *)CONCAT44(nR,in_stack_ffffffffffffffc8));
                    nFbDepth_ = (uint)((ulong)(in_RDI + 0x98) >> 0x20);
                    uVar4 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x80));
                    NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x68));
                    NaMatrix::new_dim((NaMatrix *)CONCAT44(iVar1,iVar2),nR,uVar4);
                    NaMatrix::init_zero((NaMatrix *)0x17c2ef);
                    uVar5 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x50));
                    *(uint *)(in_RDI + 0x40) = uVar5;
                    uVar5 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x80));
                    *(uint *)(in_RDI + 0x44) = uVar5;
                    uVar5 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x68));
                    *(uint *)(in_RDI + 0x48) = uVar5;
                    NaUnit::Assign((NaUnit *)CONCAT44(iVar1,iVar2),nR,uVar4,nFbDepth_);
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 2;
  __cxa_throw(puVar6,&NaException::typeinfo,0);
}

Assistant:

void
NaStateSpaceModel::SetMatrices (const NaMatrix& mA,
				const NaMatrix& mB,
				const NaMatrix& mC)
{
    if(!(mA.dim_cols() > 0 && mA.dim_rows() > 0 &&
         mB.dim_cols() > 0 && mB.dim_rows() > 0 &&
         mC.dim_cols() > 0 && mC.dim_rows() > 0 &&
         mA.dim_rows() == mA.dim_cols() &&
         mA.dim_rows() == mB.dim_rows() &&
         mA.dim_rows() == mC.dim_cols())){
         throw(na_size_mismatch);
    }

    A = mA;
    B = mB;
    C = mC;
    D.new_dim(C.dim_rows(), B.dim_cols());
    D.init_zero();

    n = A.dim_rows();
    m = C.dim_rows();
    k = B.dim_cols();

    Assign(k, m);
}